

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O3

Gia_Man_t * Gia_ManUnrollDup(Gia_Man_t *p,Vec_Int_t *vLimit)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pNew;
  size_t sVar4;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  
  if (vLimit->nSize != 0) {
    __assert_fail("Vec_IntSize(vLimit) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFrames.c"
                  ,0x70,"Gia_Man_t *Gia_ManUnrollDup(Gia_Man_t *, Vec_Int_t *)");
  }
  pNew = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  pNew->pName = pcVar5;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  pNew->pSpec = pcVar5;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  Vec_IntPush(vLimit,pNew->nObjs);
  pVVar6 = p->vCos;
  uVar7 = (ulong)(uint)pVVar6->nSize;
  if (p->nRegs < pVVar6->nSize) {
    lVar11 = 0;
    do {
      if ((int)uVar7 <= lVar11) goto LAB_00741ab8;
      iVar10 = pVVar6->pArray[lVar11];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00741a7a;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManUnrollDup_rec(pNew,p->pObjs + iVar10,iVar10);
      lVar11 = lVar11 + 1;
      pVVar6 = p->vCos;
      uVar7 = (ulong)pVVar6->nSize;
    } while (lVar11 < (long)(uVar7 - (long)p->nRegs));
  }
  Vec_IntPush(vLimit,pNew->nObjs);
  iVar10 = pNew->nObjs;
  if (1 < iVar10) {
    uVar7 = 1;
    lVar11 = 0x14;
    do {
      if ((long)vLimit->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      if (uVar7 == (uint)vLimit->pArray[(long)vLimit->nSize + -1]) {
        Vec_IntPush(vLimit,iVar10);
        iVar10 = pNew->nObjs;
      }
      lVar8 = (long)iVar10;
      if (lVar8 <= (long)uVar7) {
LAB_00741a7a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar1 = *(int *)(&pNew->pObjs->field_0x0 + lVar11);
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00741a7a;
      pGVar3 = p->pObjs;
      if ((~(uint)*(undefined8 *)(pGVar3 + iVar1) & 0x9fffffff) == 0) {
        uVar9 = (uint)((ulong)*(undefined8 *)(pGVar3 + iVar1) >> 0x20) & 0x1fffffff;
        iVar1 = p->vCis->nSize;
        if (iVar1 - p->nRegs <= (int)uVar9) {
          iVar10 = p->vCos->nSize;
          uVar9 = (iVar10 - iVar1) + uVar9;
          if (((int)uVar9 < 0) || (iVar10 <= (int)uVar9)) {
LAB_00741ab8:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar9 = p->vCos->pArray[uVar9];
          lVar8 = (long)(int)uVar9;
          if ((lVar8 < 0) || ((uint)p->nObjs <= uVar9)) goto LAB_00741a7a;
          if (pGVar3[lVar8].Value != 0xffffffff) {
            __assert_fail("!~pObj->Value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFrames.c"
                          ,0x88,"Gia_Man_t *Gia_ManUnrollDup(Gia_Man_t *, Vec_Int_t *)");
          }
          Gia_ManUnrollDup_rec(pNew,pGVar3 + lVar8,uVar9);
          iVar10 = pNew->nObjs;
          lVar8 = (long)iVar10;
        }
      }
      uVar7 = uVar7 + 1;
      lVar11 = lVar11 + 0xc;
    } while ((long)uVar7 < lVar8);
  }
  Gia_ManSetRegNum(pNew,0);
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManUnrollDup( Gia_Man_t * p, Vec_Int_t * vLimit )  
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vLimit) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );

    // save constant class
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );
 
    // create first class
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManUnrollDup_rec( pNew, pObj, Gia_ObjId(p, pObj) );
    Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );

    // create next classes
    for ( i = 1; i < Gia_ManObjNum(pNew); i++ )
    {
        if ( i == Vec_IntEntryLast(vLimit) )
            Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );
        pObj = Gia_ManObj( p, Gia_ManObj(pNew, i)->Value );
        if ( Gia_ObjIsRo(p, pObj) )
        {
            pObj = Gia_ObjRoToRi(p, pObj);
            assert( !~pObj->Value );
            Gia_ManUnrollDup_rec( pNew, pObj, Gia_ObjId(p, pObj) );
        }
    }
    Gia_ManSetRegNum( pNew, 0 );
    return pNew;
}